

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hack.c
# Opt level: O0

char * in_rooms(level *lev,xchar x,xchar y,int typewanted)

{
  ushort uVar1;
  char cVar2;
  byte bVar3;
  ushort uVar4;
  int iVar5;
  char *pcVar6;
  long lVar7;
  long lVar8;
  rm *loc;
  int step;
  int max_y_offset;
  int max_x;
  int min_y;
  int min_x;
  int typefound;
  char *ptr;
  char rno;
  int typewanted_local;
  xchar y_local;
  xchar x_local;
  level *lev_local;
  
  _min_x = (level *)(in_rooms::buf + 4);
  uVar1 = *(ushort *)&lev->locations[x][y].field_0x8;
  uVar4 = uVar1 & 0x3f;
  if ((uVar1 & 0x3f) == 0) {
    lev_local = (level *)(in_rooms::buf + 4);
  }
  else {
    if (uVar4 == 1) {
      loc._0_4_ = 2;
    }
    else {
      if (uVar4 != 2) {
        if (((typewanted == 0) ||
            (iVar5 = (int)lev->rooms[(char)uVar4 + -3].rtype, iVar5 == typewanted)) ||
           ((typewanted == 0x12 && (0x12 < iVar5)))) {
          _min_x = (level *)(in_rooms::buf + 3);
          in_rooms::buf[3] = (char)uVar4;
        }
        return _min_x->levname;
      }
      loc._0_4_ = 1;
    }
    max_x._0_1_ = x + -1;
    step = x + 1;
    cVar2 = (char)(int)loc;
    if (x < '\x01') {
      max_x._0_1_ = cVar2 + (char)max_x;
    }
    else if ('O' < x) {
      step = step - (int)loc;
    }
    max_y_offset = y + -1;
    loc._4_4_ = 2;
    if (max_y_offset < 0) {
      max_y_offset = (int)loc + max_y_offset;
      loc._4_4_ = 2 - (int)loc;
    }
    else if (0x14 < y + 1) {
      loc._4_4_ = 2 - (int)loc;
    }
    for (rno = (char)max_x; rno <= step; rno = rno + cVar2) {
      lVar7 = (long)rno;
      lVar8 = (long)max_y_offset;
      bVar3 = (byte)((uint)*(undefined4 *)&lev->locations[lVar7][lVar8].field_0x6 >> 0x10) & 0x3f;
      if (((2 < bVar3) && (pcVar6 = strchr(_min_x->levname,(int)(char)bVar3), pcVar6 == (char *)0x0)
          ) && (((typewanted == 0 ||
                 (iVar5 = (int)lev->rooms[(char)bVar3 + -3].rtype, iVar5 == typewanted)) ||
                ((typewanted == 0x12 && (0x12 < iVar5)))))) {
        _min_x[-1].field_0x1017f = bVar3;
        _min_x = (level *)&_min_x[-1].field_0x1017f;
      }
      if (cVar2 <= loc._4_4_) {
        bVar3 = (byte)((uint)*(undefined4 *)&lev->locations[lVar7][lVar8 + cVar2].field_0x6 >> 0x10)
                & 0x3f;
        if (((2 < bVar3) &&
            (pcVar6 = strchr(_min_x->levname,(int)(char)bVar3), pcVar6 == (char *)0x0)) &&
           (((typewanted == 0 ||
             (iVar5 = (int)lev->rooms[(char)bVar3 + -3].rtype, iVar5 == typewanted)) ||
            ((typewanted == 0x12 && (0x12 < iVar5)))))) {
          _min_x[-1].field_0x1017f = bVar3;
          _min_x = (level *)&_min_x[-1].field_0x1017f;
        }
        if (((((char)(cVar2 * '\x02') <= loc._4_4_) &&
             (bVar3 = (byte)((uint)*(undefined4 *)
                                    &lev->locations[lVar7][lVar8 + (char)(cVar2 * '\x02')].field_0x6
                            >> 0x10) & 0x3f, 2 < bVar3)) &&
            (pcVar6 = strchr(_min_x->levname,(int)(char)bVar3), pcVar6 == (char *)0x0)) &&
           (((typewanted == 0 ||
             (iVar5 = (int)lev->rooms[(char)bVar3 + -3].rtype, iVar5 == typewanted)) ||
            ((typewanted == 0x12 && (0x12 < iVar5)))))) {
          _min_x[-1].field_0x1017f = bVar3;
          _min_x = (level *)&_min_x[-1].field_0x1017f;
        }
      }
    }
    lev_local = _min_x;
  }
  return lev_local->levname;
}

Assistant:

char *in_rooms(const struct level *lev, xchar x, xchar y, int typewanted)
{
	static char buf[5];
	char rno, *ptr = &buf[4];
	int typefound, min_x, min_y, max_x, max_y_offset, step;
	const struct rm *loc;

#define goodtype(rno) (!typewanted || \
	     ((typefound = lev->rooms[rno - ROOMOFFSET].rtype) == typewanted) || \
	     ((typewanted == SHOPBASE) && (typefound > SHOPBASE))) \

	switch (rno = lev->locations[x][y].roomno) {
		case NO_ROOM:
			return ptr;
		case SHARED:
			step = 2;
			break;
		case SHARED_PLUS:
			step = 1;
			break;
		default:			/* i.e. a regular room # */
			if (goodtype(rno))
				*(--ptr) = rno;
			return ptr;
	}

	min_x = x - 1;
	max_x = x + 1;
	if (x < 1)
		min_x += step;
	else
	if (x >= COLNO)
		max_x -= step;

	min_y = y - 1;
	max_y_offset = 2;
	if (min_y < 0) {
		min_y += step;
		max_y_offset -= step;
	} else
	if ((min_y + max_y_offset) >= ROWNO)
		max_y_offset -= step;

	for (x = min_x; x <= max_x; x += step) {
		loc = &lev->locations[x][min_y];
		y = 0;
		if (((rno = loc[y].roomno) >= ROOMOFFSET) &&
		    !strchr(ptr, rno) && goodtype(rno))
			*(--ptr) = rno;
		y += step;
		if (y > max_y_offset)
			continue;
		if (((rno = loc[y].roomno) >= ROOMOFFSET) &&
		    !strchr(ptr, rno) && goodtype(rno))
			*(--ptr) = rno;
		y += step;
		if (y > max_y_offset)
			continue;
		if (((rno = loc[y].roomno) >= ROOMOFFSET) &&
		    !strchr(ptr, rno) && goodtype(rno))
			*(--ptr) = rno;
	}
	return ptr;
}